

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O2

void __thiscall
Reducer::tryToRemoveFunctions(std::vector<wasm::Name,std::allocator<wasm::Name>>)::
FunctionReferenceRemover::FunctionReferenceRemover(std::vector<wasm::Name,std::allocator<wasm::
Name>_>__(void *this,vector<wasm::Name,_std::allocator<wasm::Name>_> *vec)

{
  pointer pNVar1;
  pointer pNVar2;
  undefined1 auStack_48 [8];
  Name name;
  
  name.super_IString.str._M_str = (char *)((long)this + 0xb0);
  *(undefined8 *)this = 0;
  *(undefined8 *)((long)this + 8) = 0;
  *(undefined8 *)((long)this + 0xd0) = 0;
  *(undefined8 *)((long)this + 0xb0) = 0;
  *(undefined8 *)((long)this + 0xb8) = 0;
  *(undefined8 *)((long)this + 0xc0) = 0;
  *(undefined8 *)((long)this + 200) = 0;
  *(long *)((long)this + 0xd8) = (long)this + 0x108;
  *(undefined8 *)((long)this + 0xe0) = 1;
  *(undefined8 *)((long)this + 0xe8) = 0;
  *(undefined8 *)((long)this + 0xf0) = 0;
  *(undefined4 *)((long)this + 0xf8) = 0x3f800000;
  *(undefined8 *)((long)this + 0x100) = 0;
  *(undefined8 *)((long)this + 0x108) = 0;
  *(undefined8 *)((long)this + 0x120) = 0;
  *(undefined8 *)((long)this + 0x110) = 0;
  *(undefined8 *)((long)this + 0x118) = 0;
  pNVar1 = (vec->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pNVar2 = (vec->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
                super__Vector_impl_data._M_start; pNVar2 != pNVar1; pNVar2 = pNVar2 + 1) {
    auStack_48 = (undefined1  [8])(pNVar2->super_IString).str._M_len;
    name.super_IString.str._M_len = (size_t)(pNVar2->super_IString).str._M_str;
    std::__detail::
    _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)((long)this + 0xd8),(value_type *)auStack_48);
  }
  return;
}

Assistant:

FunctionReferenceRemover(std::vector<Name>& vec) {
        for (auto name : vec) {
          names.insert(name);
        }
      }